

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O0

void __thiscall Pl_SHA2::finish(Pl_SHA2 *this)

{
  Pipeline *pPVar1;
  element_type *peVar2;
  Pl_SHA2 *this_local;
  
  pPVar1 = Pipeline::next(&this->super_Pipeline);
  if (pPVar1 != (Pipeline *)0x0) {
    pPVar1 = Pipeline::next(&this->super_Pipeline);
    (*pPVar1->_vptr_Pipeline[3])();
  }
  peVar2 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->crypto);
  (*peVar2->_vptr_QPDFCryptoImpl[9])();
  this->in_progress = false;
  return;
}

Assistant:

void
Pl_SHA2::finish()
{
    if (next()) {
        next()->finish();
    }
    this->crypto->SHA2_finalize();
    this->in_progress = false;
}